

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall
CompilerContext::compile_switch_withop
          (CompilerContext *this,SyntaxTree *swnode,
          vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *cases,
          shared_ptr<Label> *break_ptr)

{
  size_t sVar1;
  pointer pvVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  SwitchAnnotation *pSVar6;
  Command *pCVar7;
  Command *pCVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  iterator iVar12;
  reference ppCVar13;
  pointer pvVar14;
  SyntaxTree *pSVar15;
  int *piVar16;
  pointer pCVar17;
  reference rhs;
  bool bVar18;
  byte local_341;
  optional<uint32_t> *local_310;
  Command *local_300;
  shared_ptr<Label> local_298;
  Case *local_288;
  __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
  local_280;
  __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
  local_278;
  Case *local_270;
  __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
  local_268;
  shared_ptr<Label> local_260;
  __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
  local_250;
  __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
  local_248;
  iterator it;
  ArgVariant local_228;
  ArgVariant local_1f0;
  ulong local_1b8;
  size_t k;
  ArgVariant local_178;
  ArgVariant local_140;
  ulong local_108;
  size_t max_cases_here;
  Command *switch_op;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  args;
  size_t i;
  reference local_c8;
  Case *c;
  iterator __end1;
  iterator __begin1;
  vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *__range1;
  Command *switch_continued;
  Command *switch_start;
  Case *case_default;
  bool has_default;
  undefined1 local_40 [8];
  vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> sorted_cases;
  shared_ptr<Label> *break_ptr_local;
  vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *cases_local;
  SyntaxTree *swnode_local;
  CompilerContext *this_local;
  
  sorted_cases.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)break_ptr;
  std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::vector
            ((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> *)local_40);
  sVar5 = std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::size(cases);
  std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::resize
            ((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> *)local_40,
             sVar5);
  pSVar6 = SyntaxTree::annotation<SwitchAnnotation_const&>(swnode);
  bVar18 = (bool)(pSVar6->has_default & 1);
  switch_start = (Command *)0x0;
  pCVar7 = std::experimental::optional<const_Command_&>::value(&this->commands->switch_start);
  pCVar8 = std::experimental::optional<const_Command_&>::value(&this->commands->switch_continued);
  iVar9 = std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::begin(cases);
  iVar10 = std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end(cases);
  iVar11 = std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::begin
                     ((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> *)
                      local_40);
  std::
  transform<__gnu_cxx::__normal_iterator<CompilerContext::Case*,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>>,__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__0>
            (iVar9._M_current,iVar10._M_current,iVar11._M_current);
  iVar11 = std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::begin
                     ((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> *)
                      local_40);
  iVar12 = std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::end
                     ((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> *)
                      local_40);
  std::
  sort<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>
            (iVar11._M_current,iVar12._M_current);
  if (bVar18 != false) {
    ppCVar13 = std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::back
                         ((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                           *)local_40);
    switch_start = (Command *)*ppCVar13;
    std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::pop_back
              ((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> *)local_40
              );
    bVar3 = Case::is_default((Case *)switch_start);
    if (!bVar3) {
      __assert_fail("case_default->is_default()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp"
                    ,0x17c,
                    "void CompilerContext::compile_switch_withop(const SyntaxTree &, std::vector<Case> &, shared_ptr<Label>)"
                   );
    }
  }
  __end1 = std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::begin(cases);
  c = (Case *)std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end(cases)
  ;
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
                                     *)&c), bVar3) {
    local_c8 = __gnu_cxx::
               __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
               ::operator*(&__end1);
    make_internal_label((CompilerContext *)&i);
    std::shared_ptr<Label>::operator=(&local_c8->target,(shared_ptr<Label> *)&i);
    std::shared_ptr<Label>::~shared_ptr((shared_ptr<Label> *)&i);
    __gnu_cxx::
    __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
    ::operator++(&__end1);
  }
  args.
  super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (pvVar2 = args.
                  super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
        pvVar14 = (pointer)std::
                           vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                           ::size((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                   *)local_40), pvVar2 < pvVar14) {
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
              *)&switch_op);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::reserve((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
               *)&switch_op,0x12);
    local_300 = pCVar8;
    if (args.
        super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      local_300 = pCVar7;
    }
    max_cases_here = (size_t)local_300;
    iVar4 = 9;
    if (args.
        super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      iVar4 = 7;
    }
    local_108 = (ulong)iVar4;
    if (args.
        super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      pSVar15 = SyntaxTree::child(swnode,0);
      get_arg(&local_140,this,pSVar15);
      std::
      vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
      ::
      emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                  *)&switch_op,&local_140);
      eggs::variants::
      variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
      ::~variant(&local_140);
      sVar5 = std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::size
                        ((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                          *)local_40);
      conv_int<unsigned_long,void>(&local_178,sVar5);
      std::
      vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
      ::
      emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                  *)&switch_op,&local_178);
      eggs::variants::
      variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
      ::~variant(&local_178);
      conv_int<bool,void>((ArgVariant *)&k,bVar18);
      std::
      vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
      ::
      emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                  *)&switch_op,
                 (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                  *)&k);
      eggs::variants::
      variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
      ::~variant((variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                  *)&k);
      local_310 = (optional<uint32_t> *)break_ptr;
      if (bVar18 != false) {
        local_310 = &switch_start->hash;
      }
      std::
      vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
      ::emplace_back<std::shared_ptr<Label>const&>
                ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                  *)&switch_op,(shared_ptr<Label> *)local_310);
    }
    for (local_1b8 = 0;
        pvVar2 = args.
                 super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage, sVar1 = max_cases_here,
        local_1b8 < local_108; local_1b8 = local_1b8 + 1) {
      pvVar14 = (pointer)std::
                         vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::
                         size((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                               *)local_40);
      if (pvVar2 < pvVar14) {
        ppCVar13 = std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::
                   operator[]((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                               *)local_40,
                              (size_type)
                              args.
                              super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        piVar16 = std::experimental::optional<int>::operator*(&(*ppCVar13)->value);
        conv_int<int,void>(&local_1f0,*piVar16);
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&switch_op,&local_1f0);
        eggs::variants::
        variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
        ::~variant(&local_1f0);
        ppCVar13 = std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::
                   operator[]((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                               *)local_40,
                              (size_type)
                              args.
                              super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::emplace_back<std::shared_ptr<Label>&>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&switch_op,&(*ppCVar13)->target);
      }
      else {
        conv_int<int,void>(&local_228,-1);
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&switch_op,&local_228);
        eggs::variants::
        variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
        ::~variant(&local_228);
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::emplace_back<std::shared_ptr<Label>&>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&switch_op,break_ptr);
      }
      args.
      super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&((args.
                              super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->_storage).
                            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_true>
                            .
                            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_true,_true>
                            .
                            super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false>
                            .field_0 + 1);
    }
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
              *)&it,(vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                     *)&switch_op);
    compile_command(this,(Command *)sVar1,
                    (vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                     *)&it,false);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
               *)&it);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
               *)&switch_op);
  }
  local_248._M_current =
       (Case *)std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::begin
                         (cases);
  while( true ) {
    local_250._M_current =
         (Case *)std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end
                           (cases);
    bVar18 = __gnu_cxx::operator!=(&local_248,&local_250);
    if (!bVar18) break;
    pCVar17 = __gnu_cxx::
              __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
              ::operator->(&local_248);
    std::shared_ptr<Label>::shared_ptr(&local_260,&pCVar17->target);
    compile_label(this,&local_260);
    std::shared_ptr<Label>::~shared_ptr(&local_260);
    local_270 = local_248._M_current;
    local_268 = std::
                next<__gnu_cxx::__normal_iterator<CompilerContext::Case*,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>>>
                          (local_248,1);
    local_278._M_current =
         (Case *)std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::end
                           (cases);
    bVar18 = __gnu_cxx::operator==(&local_268,&local_278);
    local_341 = 1;
    if (!bVar18) {
      local_288 = local_248._M_current;
      local_280 = std::
                  next<__gnu_cxx::__normal_iterator<CompilerContext::Case*,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>>>
                            (local_248,1);
      pCVar17 = __gnu_cxx::
                __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
                ::operator->(&local_280);
      rhs = __gnu_cxx::
            __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
            ::operator*(&local_248);
      bVar18 = Case::same_body_as(pCVar17,rhs);
      local_341 = bVar18 ^ 0xff;
    }
    if ((local_341 & 1) != 0) {
      pSVar15 = SyntaxTree::child(swnode,1);
      pCVar17 = __gnu_cxx::
                __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
                ::operator->(&local_248);
      sVar1 = pCVar17->first_statement_id;
      pCVar17 = __gnu_cxx::
                __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
                ::operator->(&local_248);
      compile_statements(this,pSVar15,sVar1,pCVar17->last_statement_id);
    }
    __gnu_cxx::
    __normal_iterator<CompilerContext::Case_*,_std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>_>
    ::operator++(&local_248);
  }
  std::shared_ptr<Label>::shared_ptr(&local_298,break_ptr);
  compile_label(this,&local_298);
  std::shared_ptr<Label>::~shared_ptr(&local_298);
  std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::~vector
            ((vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> *)local_40);
  return;
}

Assistant:

void CompilerContext::compile_switch_withop(const SyntaxTree& swnode, std::vector<Case>& cases, shared_ptr<Label> break_ptr)
{
    std::vector<Case*> sorted_cases;   // does not contain default, unlike `cases`
    sorted_cases.resize(cases.size());
    bool has_default = swnode.annotation<const SwitchAnnotation&>().has_default;
    const Case* case_default = nullptr;

    const Command& switch_start     = this->commands.switch_start.value();
    const Command& switch_continued = this->commands.switch_continued.value();

    std::transform(cases.begin(), cases.end(), sorted_cases.begin(), [] (auto& c) { return std::addressof<Case>(c); });

    std::sort(sorted_cases.begin(), sorted_cases.end(), [](const Case* a, const Case* b) {
        if(a->is_default()) return false; // default should be the last
        if(b->is_default()) return true;  // !a->is_default() == true
        return *a->value < *b->value;
    });

    if(has_default)
    {
        case_default = sorted_cases.back();
        sorted_cases.pop_back();
        assert(case_default->is_default());
    }

    for(auto& c : cases)
        c.target = make_internal_label();

    for(size_t i = 0; i < sorted_cases.size(); )
    {
        std::vector<ArgVariant> args;
        args.reserve(18);

        const Command& switch_op = (i == 0? switch_start : switch_continued);
        size_t max_cases_here    = (i == 0? 7 : 9);

        if(i == 0)
        {
            args.emplace_back(get_arg(swnode.child(0)));
            args.emplace_back(conv_int(sorted_cases.size()));
            args.emplace_back(conv_int(has_default));
            args.emplace_back(has_default? case_default->target : break_ptr);
        }

        for(size_t k = 0; k < max_cases_here; ++k, ++i)
        {
            if(i < sorted_cases.size())
            {
                args.emplace_back(conv_int(*sorted_cases[i]->value));
                args.emplace_back(sorted_cases[i]->target);
            }
            else
            {
                args.emplace_back(conv_int(-1));
                args.emplace_back(break_ptr);
            }
        }

        compile_command(switch_op, std::move(args));
    }

    for(auto it = cases.begin(); it != cases.end(); ++it)
    {
        compile_label(it->target);
        if(std::next(it) == cases.end() || !std::next(it)->same_body_as(*it))
        {
            compile_statements(swnode.child(1), it->first_statement_id, it->last_statement_id);
        }
    }

    compile_label(break_ptr);
}